

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olddecorations.cpp
# Opt level: O2

void ParseSpriteFrames(PClassActor *info,TArray<FState,_FState> *states,
                      TArray<FScriptPosition,_FScriptPosition> *SourceLines,FScanner *sc)

{
  bool bVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  char *stop;
  FState state;
  
  pcVar3 = strtok(sc->String,",\t\n\r");
  state.NextState = (FState *)0x0;
  state.ActionFunc = (VMFunction *)0x0;
  state.sprite = 0;
  state.Tics = 0;
  state.TicRange = 0;
  state.Misc1 = 0;
  state.Misc2 = 0;
  state._24_8_ = (ulong)info->DefaultStateUsage << 0x28;
LAB_0051df37:
  if (pcVar3 == (char *)0x0) {
    return;
  }
  pcVar3 = pcVar3 + -1;
  do {
    pcVar4 = pcVar3 + 1;
    pcVar3 = pcVar3 + 1;
  } while (*pcVar4 == ' ');
  pcVar4 = strchr(pcVar3,0x3a);
  if (pcVar4 == (char *)0x0) {
    lVar5 = 4;
  }
  else {
    *pcVar4 = '\0';
    lVar5 = strtol(pcVar3,&stop,10);
    if ((int)lVar5 - 0xffffU < 0xffff0002 || pcVar3 == stop) {
      FScanner::ScriptError(sc,"Rates must be in the range [0,65534]");
    }
    pcVar3 = pcVar4 + 1;
  }
  state.Tics = (int16_t)lVar5;
  state.TicRange = 0;
  bVar1 = true;
  do {
    cVar2 = *pcVar3;
    if (cVar2 != ' ') {
      if (cVar2 == '*') {
        if (bVar1) {
          FScanner::ScriptError(sc,"* must come after a frame");
        }
        state._24_8_ = state._24_8_ | 0x40000;
      }
      else {
        if (cVar2 == '\0') break;
        if ((byte)(cVar2 + 0xa2U) < 0xe3) {
          FScanner::ScriptError(sc,"Frames must be A-Z, [, \\, or ]");
        }
        else {
          if (!bVar1) {
            TArray<FState,_FState>::Push(states,&state);
            FScriptPosition::FScriptPosition((FScriptPosition *)&stop,sc);
            TArray<FScriptPosition,_FScriptPosition>::Push(SourceLines,(FScriptPosition *)&stop);
            FString::~FString((FString *)&stop);
            cVar2 = *pcVar3;
          }
          state.Frame = cVar2 + 0xbf;
          bVar1 = false;
        }
      }
    }
    pcVar3 = pcVar3 + 1;
  } while( true );
  if (!bVar1) {
    TArray<FState,_FState>::Push(states,&state);
    FScriptPosition::FScriptPosition((FScriptPosition *)&stop,sc);
    TArray<FScriptPosition,_FScriptPosition>::Push(SourceLines,(FScriptPosition *)&stop);
    FString::~FString((FString *)&stop);
  }
  pcVar3 = strtok((char *)0x0,",\t\n\r");
  goto LAB_0051df37;
}

Assistant:

static void ParseSpriteFrames (PClassActor *info, TArray<FState> &states, TArray<FScriptPosition> &SourceLines, FScanner &sc)
{
	FState state;
	char *token = strtok (sc.String, ",\t\n\r");

	memset (&state, 0, sizeof(state));
	state.UseFlags = info->DefaultStateUsage;

	while (token != NULL)
	{
		// Skip leading white space
		while (*token == ' ')
			token++;

		int rate = 4;
		bool firstState = true;
		char *colon = strchr (token, ':');

		if (colon != NULL)
		{
			char *stop;

			*colon = 0;
			rate = strtol (token, &stop, 10);
			if (stop == token || rate < 1 || rate > 65534)
			{
				sc.ScriptError ("Rates must be in the range [0,65534]");
			}
			token = colon + 1;
		}

		state.Tics = rate;
		state.TicRange = 0;

		while (*token)
		{
			if (*token == ' ')
			{
			}
			else if (*token == '*')
			{
				if (firstState)
				{
					sc.ScriptError ("* must come after a frame");
				}
				state.StateFlags |= STF_FULLBRIGHT;
			}
			else if (*token < 'A' || *token > ']')
			{
				sc.ScriptError ("Frames must be A-Z, [, \\, or ]");
			}
			else
			{
				if (!firstState)
				{
					states.Push (state);
					SourceLines.Push(sc);
				}
				firstState = false;
				state.Frame = *token-'A';	
			}
			++token;
		}
		if (!firstState)
		{
			states.Push (state);
			SourceLines.Push(sc);
		}

		token = strtok (NULL, ",\t\n\r");
	}
}